

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

result_type __thiscall
WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_19UL,_1UL,_16UL,_15UL,_14UL,_boost::random::detail::M3<19>,_boost::random::detail::M3<11>,_boost::random::detail::M3<-14>,_boost::random::detail::M1,_boost::random::detail::M3<18>,_boost::random::detail::M1,_boost::random::detail::M0,_boost::random::detail::M3<-5>,_boost::random::detail::no_tempering>,_2068857834U>
::generate(WellTestCase<boost::random::well_engine<unsigned_int,_32UL,_19UL,_1UL,_16UL,_15UL,_14UL,_boost::random::detail::M3<19>,_boost::random::detail::M3<11>,_boost::random::detail::M3<_14>,_boost::random::detail::M1,_boost::random::detail::M3<18>,_boost::random::detail::M1,_boost::random::detail::M0,_boost::random::detail::M3<_5>,_boost::random::detail::no_tempering>,_2068857834U>
           *this)

{
  result_type rVar1;
  long lVar2;
  ulong extraout_RAX;
  int iVar4;
  uint *p;
  uint state [19];
  uint *local_70;
  uint local_68 [22];
  ulong uVar3;
  
  for (lVar2 = 0; lVar2 != 0x4c; lVar2 = lVar2 + 4) {
    *(undefined4 *)((long)local_68 + lVar2) = 1;
  }
  local_70 = local_68;
  boost::random::
  well_engine<unsigned_int,32ul,19ul,1ul,16ul,15ul,14ul,boost::random::detail::M3<19>,boost::random::detail::M3<11>,boost::random::detail::M3<-14>,boost::random::detail::M1,boost::random::detail::M3<18>,boost::random::detail::M1,boost::random::detail::M0,boost::random::detail::M3<-5>,boost::random::detail::no_tempering>
  ::seed<unsigned_int*>
            ((well_engine<unsigned_int,32ul,19ul,1ul,16ul,15ul,14ul,boost::random::detail::M3<19>,boost::random::detail::M3<11>,boost::random::detail::M3<_14>,boost::random::detail::M1,boost::random::detail::M3<18>,boost::random::detail::M1,boost::random::detail::M0,boost::random::detail::M3<_5>,boost::random::detail::no_tempering>
              *)this,&local_70,local_68 + 0x13);
  uVar3 = extraout_RAX;
  for (iVar4 = -1000000000; iVar4 != 0; iVar4 = iVar4 + 1) {
    rVar1 = boost::random::
            well_engine<unsigned_int,_32UL,_19UL,_1UL,_16UL,_15UL,_14UL,_boost::random::detail::M3<19>,_boost::random::detail::M3<11>,_boost::random::detail::M3<-14>,_boost::random::detail::M1,_boost::random::detail::M3<18>,_boost::random::detail::M1,_boost::random::detail::M0,_boost::random::detail::M3<-5>,_boost::random::detail::no_tempering>
            ::operator()(&this->rng);
    uVar3 = (ulong)rVar1;
  }
  return (result_type)uVar3;
}

Assistant:

result_type generate()
    {
        unsigned state[RandomNumberGenerator::state_size];
        std::uninitialized_fill_n(state, boost::size(state), 1);

        unsigned* p = state;
        rng.seed(p, boost::end(state));

        result_type x;

        int iterations = 1000000000;

        while (iterations-- > 0)
            x = rng();

        return x;
    }